

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGP4.cc
# Opt level: O1

void __thiscall
libsgp4::SGP4::DeepSpaceInitialise
          (SGP4 *this,double eosq,double sinio,double cosio,double betao,double theta2,double betao2
          ,double xmdot,double omgdot,double xnodot)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double local_1f8;
  double local_1e8;
  double local_1d8;
  double local_1c8;
  double local_1b8;
  double local_198;
  double local_190;
  double local_188;
  double local_160;
  double local_158;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_38;
  
  dVar6 = 1.0 / (this->elements_).recovered_semi_major_axis_;
  local_158 = sin((this->elements_).ascending_node_);
  local_160 = cos((this->elements_).ascending_node_);
  dVar7 = sin((this->elements_).argument_perigee_);
  dVar8 = cos((this->elements_).argument_perigee_);
  dVar16 = (double)(this->elements_).epoch_.m_encoded / 86400000000.0 + 1721425.5 + -2415020.0;
  dVar19 = dVar16 * -0.00092422029 + 4.523602;
  dVar9 = floor(dVar19 / 6.283185307179586);
  dVar19 = dVar9 * -6.283185307179586 + dVar19;
  dVar10 = sin(dVar19);
  dVar11 = cos(dVar19);
  dVar9 = dVar11 * -0.03568096 + 0.91375164;
  dVar12 = 1.0 - dVar9 * dVar9;
  if (dVar12 < 0.0) {
    dVar12 = sqrt(dVar12);
  }
  else {
    dVar12 = SQRT(dVar12);
  }
  dVar1 = (dVar10 * 0.089683511) / dVar12;
  dVar13 = 1.0 - dVar1 * dVar1;
  if (dVar13 < 0.0) {
    dVar13 = sqrt(dVar13);
  }
  else {
    dVar13 = SQRT(dVar13);
  }
  dVar15 = dVar16 * 0.001944368 + 5.8351514;
  dVar20 = (dVar16 * 0.2299715 + 4.7199672) - dVar15;
  dVar14 = floor(dVar20 / 6.283185307179586);
  (this->deepspace_consts_).zmol = dVar14 * -6.283185307179586 + dVar20;
  local_e0 = 0.39785416;
  local_e8 = 0.91744867;
  dVar10 = atan2((dVar10 * 0.39785416) / dVar12,dVar11 * dVar13 + dVar1 * 0.91744867 * dVar10);
  dVar19 = (dVar10 + dVar15) - dVar19;
  dVar15 = cos(dVar19);
  dVar19 = sin(dVar19);
  dVar16 = dVar16 * 0.017201977 + 6.2565837;
  dVar10 = floor(dVar16 / 6.283185307179586);
  (this->deepspace_consts_).zmos = dVar10 * -6.283185307179586 + dVar16;
  dVar16 = (this->elements_).recovered_mean_motion_;
  dVar10 = (this->elements_).eccentricity_;
  dVar11 = (this->elements_).inclination_;
  dVar14 = local_158 * dVar1;
  dVar20 = local_158 * dVar13;
  dVar13 = dVar13 * local_160;
  dVar1 = dVar1 * local_160;
  local_f0 = 0.01675;
  local_38 = 1.19459e-05;
  local_f8 = 2.9864797e-06;
  local_100 = -0.98088458;
  local_108 = 0.1945905;
  bVar5 = true;
  do {
    bVar4 = bVar5;
    dVar47 = local_108 * local_160 + local_158 * local_e8 * local_100;
    dVar27 = local_158 * local_e8 * local_108 - local_100 * local_160;
    dVar3 = local_e8 * local_100 * local_160 - local_108 * local_158;
    dVar30 = local_100 * local_158 + local_e8 * local_108 * local_160;
    dVar48 = cosio * dVar3 + local_e0 * local_100 * sinio;
    dVar28 = cosio * dVar30 + local_e0 * local_108 * sinio;
    dVar34 = dVar3 * -sinio + local_e0 * local_100 * cosio;
    dVar31 = dVar30 * -sinio + local_e0 * local_108 * cosio;
    dVar3 = dVar47 * dVar8 + dVar7 * dVar48;
    dVar32 = dVar27 * dVar8 + dVar7 * dVar28;
    dVar21 = dVar8 * dVar48 - dVar47 * dVar7;
    dVar22 = dVar8 * dVar28 - dVar27 * dVar7;
    dVar37 = dVar3 * 12.0 * dVar3 + dVar21 * -3.0 * dVar21;
    dVar30 = dVar21 * -6.0;
    dVar43 = dVar3 * 24.0 * dVar32 + dVar22 * dVar30;
    dVar44 = dVar32 * 12.0 * dVar32 + dVar22 * -3.0 * dVar22;
    dVar41 = (dVar47 * dVar47 + dVar48 * dVar48) * 3.0 + dVar37 * eosq;
    dVar29 = (dVar47 * dVar27 + dVar48 * dVar28) * 6.0 + dVar43 * eosq;
    dVar23 = (dVar27 * dVar27 + dVar28 * dVar28) * 3.0 + dVar44 * eosq;
    dVar49 = dVar7 * dVar34;
    dVar46 = dVar8 * dVar34;
    dVar24 = dVar47 * -6.0 * dVar34 + (dVar3 * -24.0 * dVar46 + dVar49 * dVar30) * eosq;
    dVar35 = dVar8 * dVar31;
    dVar38 = dVar7 * dVar31;
    dVar25 = dVar27 * -6.0 * dVar31 + (dVar32 * -24.0 * dVar35 + dVar38 * dVar22 * -6.0) * eosq;
    dVar30 = dVar48 * 6.0 * dVar34 + (dVar3 * 24.0 * dVar49 + dVar30 * dVar46) * eosq;
    dVar39 = dVar28 * 6.0 * dVar31 + (dVar32 * 24.0 * dVar38 + dVar22 * -6.0 * dVar35) * eosq;
    dVar40 = betao2 * dVar37 + dVar41 + dVar41;
    dVar36 = betao2 * dVar44 + dVar23 + dVar23;
    dVar33 = (1.0 / dVar16) * local_f8;
    dVar42 = (dVar33 * -0.5) / betao;
    dVar41 = dVar33 * betao;
    dVar23 = dVar41 * dVar10 * -15.0;
    local_188 = 0.0;
    if (dVar11 <= 3.0892327765897933 && 0.052359877 <= dVar11) {
      local_188 = ((dVar30 + dVar39) * -local_38 * dVar42) / sinio;
    }
    dVar45 = (dVar3 * dVar21 + dVar32 * dVar22) * local_38 * dVar23;
    dVar2 = local_38 * dVar42 * (dVar24 + dVar25);
    dVar18 = dVar33 * -local_38 * (eosq * -6.0 + dVar40 + dVar36 + -14.0);
    dVar17 = local_38 * dVar41 * (dVar37 + dVar44 + -6.0);
    dVar26 = (dVar21 * dVar32 + dVar22 * dVar3) * (dVar23 + dVar23);
    dVar23 = (dVar32 * dVar22 - dVar3 * dVar21) * (dVar23 + dVar23);
    dVar27 = ((dVar47 * dVar31 + dVar27 * dVar34) * -6.0 +
             ((dVar32 * dVar46 + dVar3 * dVar35) * -24.0 +
             (dVar21 * dVar38 + dVar49 * dVar22) * -6.0) * eosq) * (dVar42 + dVar42);
    dVar25 = (dVar25 - dVar24) * (dVar42 + dVar42);
    dVar47 = dVar43 * (dVar41 + dVar41);
    dVar24 = (dVar44 - dVar37) * (dVar41 + dVar41);
    dVar28 = ((dVar34 * dVar28 + dVar48 * dVar31) * 6.0 +
             ((dVar49 * dVar32 + dVar3 * dVar38) * 24.0 + (dVar46 * dVar22 + dVar21 * dVar35) * -6.0
             ) * eosq) * dVar42 * -2.0;
    dVar3 = (dVar39 - dVar30) * dVar42 * -2.0;
    dVar33 = dVar33 * -2.0;
    dVar22 = (betao2 * dVar43 + dVar29 + dVar29) * dVar33;
    dVar21 = (dVar36 - dVar40) * dVar33;
    dVar34 = dVar33 * (eosq * -9.0 + -21.0) * local_f0;
    dVar30 = dVar41 * -18.0 * local_f0;
    if (bVar4) {
      (this->deepspace_consts_).sse = dVar45;
      (this->deepspace_consts_).ssi = dVar2;
      (this->deepspace_consts_).ssl = dVar18;
      (this->deepspace_consts_).ssh = local_188;
      (this->deepspace_consts_).ssg = -cosio * local_188 + dVar17;
      (this->deepspace_consts_).se2 = dVar26;
      (this->deepspace_consts_).si2 = dVar27;
      (this->deepspace_consts_).sl2 = dVar22;
      (this->deepspace_consts_).sgh2 = dVar47;
      (this->deepspace_consts_).sh2 = dVar28;
      (this->deepspace_consts_).se3 = dVar23;
      (this->deepspace_consts_).si3 = dVar25;
      (this->deepspace_consts_).sl3 = dVar21;
      (this->deepspace_consts_).sgh3 = dVar24;
      (this->deepspace_consts_).sh3 = dVar3;
      (this->deepspace_consts_).sl4 = dVar34;
      (this->deepspace_consts_).sgh4 = dVar30;
      local_f0 = 0.0549;
      local_38 = 0.00015835218;
      local_f8 = 4.7968065e-07;
      local_160 = dVar13 + dVar14;
      local_158 = dVar20 - dVar1;
      local_108 = dVar15;
      local_100 = dVar19;
      local_e8 = dVar9;
      local_e0 = dVar12;
    }
    bVar5 = false;
  } while (bVar4);
  (this->deepspace_consts_).ee2 = dVar26;
  (this->deepspace_consts_).e3 = dVar23;
  (this->deepspace_consts_).xi2 = dVar27;
  (this->deepspace_consts_).xi3 = dVar25;
  (this->deepspace_consts_).xl2 = dVar22;
  (this->deepspace_consts_).xl3 = dVar21;
  (this->deepspace_consts_).xl4 = dVar34;
  (this->deepspace_consts_).xgh2 = dVar47;
  (this->deepspace_consts_).xgh3 = dVar24;
  (this->deepspace_consts_).xgh4 = dVar30;
  (this->deepspace_consts_).xh2 = dVar28;
  (this->deepspace_consts_).xh3 = dVar3;
  (this->deepspace_consts_).sse = dVar45 + (this->deepspace_consts_).sse;
  (this->deepspace_consts_).ssi = dVar2 + (this->deepspace_consts_).ssi;
  dVar18 = dVar18 + (this->deepspace_consts_).ssl;
  (this->deepspace_consts_).ssl = dVar18;
  dVar9 = (dVar17 - cosio * local_188) + (this->deepspace_consts_).ssg;
  (this->deepspace_consts_).ssg = dVar9;
  local_188 = local_188 + (this->deepspace_consts_).ssh;
  (this->deepspace_consts_).ssh = local_188;
  (this->deepspace_consts_).shape = NONE;
  if ((0.0052359877 <= dVar16) || (dVar16 <= 0.0034906585)) {
    dVar9 = 0.0;
    if ((0.00826 <= dVar16) &&
       ((dVar9 = 0.0, dVar16 <= 0.00924 &&
        (dVar7 = (this->elements_).eccentricity_, dVar9 = 0.0, 0.5 <= dVar7)))) {
      (this->deepspace_consts_).shape = RESONANCE;
      dVar8 = dVar7 * dVar7;
      dVar9 = dVar7 * dVar8;
      if (dVar7 <= 0.65) {
        local_1f8 = dVar9 * 0.0 + dVar8 * 16.29 + dVar7 * -13.247 + 3.616;
        local_1b8 = dVar9 * 156.591 + dVar8 * -228.419 + dVar7 * 117.39 + -19.302;
        local_1e8 = dVar9 * 146.5816 + dVar8 * -214.6334 + dVar7 * 109.7927 + -18.9068;
        local_1d8 = dVar9 * 313.953 + dVar8 * -471.094 + dVar7 * 242.694 + -41.122;
        local_1c8 = dVar9 * 1083.435 + dVar8 * -1629.014 + dVar7 * 841.88 + -146.407;
        dVar10 = dVar8 * -5740.032 + dVar7 * 3017.977 + -532.114;
        dVar11 = 3708.276;
      }
      else {
        local_1f8 = dVar9 * 266.724 + dVar8 * -508.738 + dVar7 * 331.819 + -72.099;
        local_1b8 = dVar9 * 1246.113 + dVar8 * -2415.925 + dVar7 * 1582.851 + -346.844;
        local_1e8 = dVar9 * 1215.972 + dVar8 * -2366.899 + dVar7 * 1554.908 + -342.585;
        local_1d8 = dVar9 * 3651.957 + dVar8 * -7193.992 + dVar7 * 4758.686 + -1052.797;
        local_1c8 = dVar9 * 12422.52 + dVar8 * -24462.77 + dVar7 * 16178.11 + -3581.69;
        if (dVar7 <= 0.715) {
          dVar10 = dVar8 * 3763.64 + dVar7 * -4664.75 + 1464.74;
          dVar11 = 0.0;
        }
        else {
          dVar10 = dVar8 * -54087.36 + dVar7 * 29936.92 + -5149.66;
          dVar11 = 31324.56;
        }
      }
      if (0.7 <= dVar7) {
        local_190 = dVar9 * 109377.94 + dVar8 * -229838.2 + dVar7 * 161616.52 + -37995.78;
        local_198 = dVar9 * 146349.42 + dVar8 * -309468.16 + dVar7 * 218913.95 + -51752.104;
        dVar12 = dVar8 * -242699.48 + dVar7 * 170470.89 + -40023.88;
        dVar8 = dVar9 * 115605.82;
      }
      else {
        local_190 = dVar9 * 5542.21 + dVar8 * -9064.77 + dVar7 * 4988.61 + -919.2277;
        local_198 = dVar9 * 5337.524 + dVar8 * -8491.4146 + dVar7 * 4568.6173 + -822.71072;
        dVar12 = dVar8 * -8624.77 + dVar7 * 4690.25 + -853.666;
        dVar8 = dVar9 * 5341.4;
      }
      dVar15 = cosio + cosio + 1.0;
      dVar19 = 1.0 - (cosio + cosio);
      dVar13 = sinio * sinio;
      dVar14 = theta2 * -3.0 + dVar15;
      dVar1 = dVar16 * dVar16 * 3.0 * dVar6 * dVar6;
      dVar20 = (dVar15 + theta2) * 0.75;
      dVar15 = dVar6 * dVar1;
      dVar1 = dVar1 * 1.7891679e-06;
      (this->deepspace_consts_).d2201 = dVar20 * dVar1 * ((dVar7 + -0.64) * -0.44 + -0.306);
      dVar7 = dVar6 * dVar15;
      dVar15 = dVar15 * 3.7393792e-07;
      (this->deepspace_consts_).d2211 = dVar1 * dVar13 * 1.5 * local_1f8;
      (this->deepspace_consts_).d3210 =
           (theta2 * -3.0 + dVar19) * sinio * 1.875 * dVar15 * local_1b8;
      (this->deepspace_consts_).d3222 = dVar15 * sinio * -1.875 * dVar14 * local_1e8;
      dVar6 = dVar6 * dVar7;
      dVar7 = (dVar7 + dVar7) * 7.3636953e-09;
      (this->deepspace_consts_).d4410 = dVar13 * 35.0 * dVar20 * dVar7 * local_1d8;
      (this->deepspace_consts_).d4422 = dVar7 * dVar13 * 39.375 * dVar13 * local_1c8;
      (this->deepspace_consts_).d5220 =
           ((theta2 * -5.0 + dVar19) * dVar13 + (theta2 * 6.0 + cosio * 4.0 + -2.0) * 0.33333333) *
           sinio * 9.84375 * dVar6 * 1.1428639e-07 * (dVar11 * dVar9 + dVar10);
      (this->deepspace_consts_).d5232 =
           dVar6 * 1.1428639e-07 *
           (dVar14 * 6.56250012 + (cosio * -4.0 + -2.0 + theta2 * 10.0) * dVar13 * 4.92187512) *
           sinio * (dVar8 + dVar12);
      dVar9 = (dVar6 + dVar6) * 2.1765803e-09;
      (this->deepspace_consts_).d5421 =
           ((cosio * 8.0 + -12.0 + theta2 * 10.0) * theta2 + cosio * -8.0 + 2.0) * sinio * 29.53125
           * dVar9 * local_198;
      (this->deepspace_consts_).d5433 =
           dVar9 * ((theta2 * -10.0 + cosio * 8.0 + 12.0) * theta2 + cosio * -8.0 + -2.0) *
                   sinio * 29.53125 * local_190;
      dVar9 = (this->elements_).ascending_node_;
      dVar6 = (this->deepspace_consts_).gsto;
      dVar6 = (((this->elements_).mean_anomoly_ + dVar9 + dVar9) - dVar6) - dVar6;
      dVar9 = floor(dVar6 / 6.283185307179586);
      (this->deepspace_consts_).xlamo = dVar9 * -6.283185307179586 + dVar6;
      dVar9 = xmdot + xnodot + xnodot + -0.0043752690880113 + -0.0043752690880113 + dVar18 +
              local_188 + local_188;
    }
  }
  else {
    (this->deepspace_consts_).shape = SYNCHRONOUS;
    dVar8 = cosio + 1.0;
    dVar7 = dVar16 * 3.0 * dVar16 * dVar6 * dVar6;
    (this->deepspace_consts_).del2 =
         (dVar7 + dVar7) * dVar8 * dVar8 * 0.75 * ((eosq * 0.8125 + -2.5) * eosq + 1.0) *
         1.7891679e-06;
    (this->deepspace_consts_).del3 =
         dVar7 * 3.0 * dVar8 * 1.875 * dVar8 * dVar8 * ((eosq * 6.60937 + -6.0) * eosq + 1.0) *
         2.2123015e-07 * dVar6;
    (this->deepspace_consts_).del1 =
         dVar7 * ((cosio * 3.0 + 1.0) * sinio * 0.9375 * sinio - dVar8 * 0.75) * (eosq + eosq + 1.0)
         * 2.1460748e-06 * dVar6;
    dVar6 = ((this->elements_).mean_anomoly_ + (this->elements_).ascending_node_ +
            (this->elements_).argument_perigee_) - (this->deepspace_consts_).gsto;
    dVar7 = floor(dVar6 / 6.283185307179586);
    (this->deepspace_consts_).xlamo = dVar7 * -6.283185307179586 + dVar6;
    dVar9 = omgdot + xnodot + xmdot + -0.0043752690880113 + dVar18 + dVar9 + local_188;
  }
  if ((this->deepspace_consts_).shape != NONE) {
    (this->deepspace_consts_).xfact = dVar9 - dVar16;
    (this->integrator_params_).atime = 0.0;
    (this->integrator_params_).xni = dVar16;
    (this->integrator_params_).xli = (this->deepspace_consts_).xlamo;
  }
  return;
}

Assistant:

void SGP4::DeepSpaceInitialise(
        const double eosq,
        const double sinio,
        const double cosio,
        const double betao,
        const double theta2,
        const double betao2,
        const double xmdot,
        const double omgdot,
        const double xnodot)
{
    double se = 0.0;
    double si = 0.0;
    double sl = 0.0;
    double sgh = 0.0;
    double shdq = 0.0;

    double bfact = 0.0;

    static const double ZNS = 1.19459E-5;
    static const double C1SS = 2.9864797E-6;
    static const double ZES = 0.01675;
    static const double ZNL = 1.5835218E-4;
    static const double C1L = 4.7968065E-7;
    static const double ZEL = 0.05490;
    static const double ZCOSIS = 0.91744867;
    static const double ZSINI = 0.39785416;
    static const double ZSINGS = -0.98088458;
    static const double ZCOSGS = 0.1945905;
    static const double Q22 = 1.7891679E-6;
    static const double Q31 = 2.1460748E-6;
    static const double Q33 = 2.2123015E-7;
    static const double ROOT22 = 1.7891679E-6;
    static const double ROOT32 = 3.7393792E-7;
    static const double ROOT44 = 7.3636953E-9;
    static const double ROOT52 = 1.1428639E-7;
    static const double ROOT54 = 2.1765803E-9;

    const double aqnv = 1.0 / elements_.RecoveredSemiMajorAxis();
    const double xpidot = omgdot + xnodot;
    const double sinq = sin(elements_.AscendingNode());
    const double cosq = cos(elements_.AscendingNode());
    const double sing = sin(elements_.ArgumentPerigee());
    const double cosg = cos(elements_.ArgumentPerigee());

    /*
     * initialize lunar / solar terms
     */
    const double jday = elements_.Epoch().ToJ2000();

    const double xnodce = Util::WrapTwoPI(4.5236020 - 9.2422029e-4 * jday);
    const double stem = sin(xnodce);
    const double ctem = cos(xnodce);
    const double zcosil = 0.91375164 - 0.03568096 * ctem;
    const double zsinil = sqrt(1.0 - zcosil * zcosil);
    const double zsinhl = 0.089683511 * stem / zsinil;
    const double zcoshl = sqrt(1.0 - zsinhl * zsinhl);
    const double c = 4.7199672 + 0.22997150 * jday;
    const double gam = 5.8351514 + 0.0019443680 * jday;
    deepspace_consts_.zmol = Util::WrapTwoPI(c - gam);
    double zx = 0.39785416 * stem / zsinil;
    double zy = zcoshl * ctem + 0.91744867 * zsinhl * stem;
    zx = atan2(zx, zy);
    zx = gam + zx - xnodce;

    const double zcosgl = cos(zx);
    const double zsingl = sin(zx);
    deepspace_consts_.zmos = Util::WrapTwoPI(6.2565837 + 0.017201977 * jday);

    /*
     * do solar terms
     */
    double zcosg = ZCOSGS;
    double zsing = ZSINGS;
    double zcosi = ZCOSIS;
    double zsini = ZSINI;
    double zcosh = cosq;
    double zsinh = sinq;
    double cc = C1SS;
    double zn = ZNS;
    double ze = ZES;
    const double xnoi = 1.0 / elements_.RecoveredMeanMotion();

    for (int cnt = 0; cnt < 2; cnt++)
    {
        /*
         * solar terms are done a second time after lunar terms are done
         */
        const double a1 = zcosg * zcosh + zsing * zcosi * zsinh;
        const double a3 = -zsing * zcosh + zcosg * zcosi * zsinh;
        const double a7 = -zcosg * zsinh + zsing * zcosi * zcosh;
        const double a8 = zsing * zsini;
        const double a9 = zsing * zsinh + zcosg * zcosi*zcosh;
        const double a10 = zcosg * zsini;
        const double a2 = cosio * a7 + sinio * a8;
        const double a4 = cosio * a9 + sinio * a10;
        const double a5 = -sinio * a7 + cosio * a8;
        const double a6 = -sinio * a9 + cosio * a10;
        const double x1 = a1 * cosg + a2 * sing;
        const double x2 = a3 * cosg + a4 * sing;
        const double x3 = -a1 * sing + a2 * cosg;
        const double x4 = -a3 * sing + a4 * cosg;
        const double x5 = a5 * sing;
        const double x6 = a6 * sing;
        const double x7 = a5 * cosg;
        const double x8 = a6 * cosg;
        const double z31 = 12.0 * x1 * x1 - 3. * x3 * x3;
        const double z32 = 24.0 * x1 * x2 - 6. * x3 * x4;
        const double z33 = 12.0 * x2 * x2 - 3. * x4 * x4;
        double z1 = 3.0 * (a1 * a1 + a2 * a2) + z31 * eosq;
        double z2 = 6.0 * (a1 * a3 + a2 * a4) + z32 * eosq;
        double z3 = 3.0 * (a3 * a3 + a4 * a4) + z33 * eosq;

        const double z11 = -6.0 * a1 * a5
            + eosq * (-24. * x1 * x7 - 6. * x3 * x5);
        const double z12 = -6.0 * (a1 * a6 + a3 * a5) 
            + eosq * (-24. * (x2 * x7 + x1 * x8) - 6. * (x3 * x6 + x4 * x5));
        const double z13 = -6.0 * a3 * a6
            + eosq * (-24. * x2 * x8 - 6. * x4 * x6);
        const double z21 = 6.0 * a2 * a5
            + eosq * (24. * x1 * x5 - 6. * x3 * x7);
        const double z22 = 6.0 * (a4 * a5 + a2 * a6)
            + eosq * (24. * (x2 * x5 + x1 * x6) - 6. * (x4 * x7 + x3 * x8));
        const double z23 = 6.0 * a4 * a6
            + eosq * (24. * x2 * x6 - 6. * x4 * x8);

        z1 = z1 + z1 + betao2 * z31;
        z2 = z2 + z2 + betao2 * z32;
        z3 = z3 + z3 + betao2 * z33;

        const double s3 = cc * xnoi;
        const double s2 = -0.5 * s3 / betao;
        const double s4 = s3 * betao;
        const double s1 = -15.0 * elements_.Eccentricity() * s4;
        const double s5 = x1 * x3 + x2 * x4;
        const double s6 = x2 * x3 + x1 * x4;
        const double s7 = x2 * x4 - x1 * x3;

        se = s1 * zn * s5;
        si = s2 * zn * (z11 + z13);
        sl = -zn * s3 * (z1 + z3 - 14.0 - 6.0 * eosq);
        sgh = s4 * zn * (z31 + z33 - 6.0);

        /*
         * replaced
         * sh = -zn * s2 * (z21 + z23
         * with
         * shdq = (-zn * s2 * (z21 + z23)) / sinio
         */
        if (elements_.Inclination() < 5.2359877e-2
                || elements_.Inclination() > kPI - 5.2359877e-2)
        {
            shdq = 0.0;
        }
        else
        {
            shdq = (-zn * s2 * (z21 + z23)) / sinio;
        }

        deepspace_consts_.ee2 = 2.0 * s1 * s6;
        deepspace_consts_.e3 = 2.0 * s1 * s7;
        deepspace_consts_.xi2 = 2.0 * s2 * z12;
        deepspace_consts_.xi3 = 2.0 * s2 * (z13 - z11);
        deepspace_consts_.xl2 = -2.0 * s3 * z2;
        deepspace_consts_.xl3 = -2.0 * s3 * (z3 - z1);
        deepspace_consts_.xl4 = -2.0 * s3 * (-21.0 - 9.0 * eosq) * ze;
        deepspace_consts_.xgh2 = 2.0 * s4 * z32;
        deepspace_consts_.xgh3 = 2.0 * s4 * (z33 - z31);
        deepspace_consts_.xgh4 = -18.0 * s4 * ze;
        deepspace_consts_.xh2 = -2.0 * s2 * z22;
        deepspace_consts_.xh3 = -2.0 * s2 * (z23 - z21);

        if (cnt == 1)
        {
            break;
        }
        /*
         * do lunar terms
         */
        deepspace_consts_.sse = se;
        deepspace_consts_.ssi = si;
        deepspace_consts_.ssl = sl;
        deepspace_consts_.ssh = shdq;
        deepspace_consts_.ssg = sgh - cosio * deepspace_consts_.ssh;
        deepspace_consts_.se2 = deepspace_consts_.ee2;
        deepspace_consts_.si2 = deepspace_consts_.xi2;
        deepspace_consts_.sl2 = deepspace_consts_.xl2;
        deepspace_consts_.sgh2 = deepspace_consts_.xgh2;
        deepspace_consts_.sh2 = deepspace_consts_.xh2;
        deepspace_consts_.se3 = deepspace_consts_.e3;
        deepspace_consts_.si3 = deepspace_consts_.xi3;
        deepspace_consts_.sl3 = deepspace_consts_.xl3;
        deepspace_consts_.sgh3 = deepspace_consts_.xgh3;
        deepspace_consts_.sh3 = deepspace_consts_.xh3;
        deepspace_consts_.sl4 = deepspace_consts_.xl4;
        deepspace_consts_.sgh4 = deepspace_consts_.xgh4;
        zcosg = zcosgl;
        zsing = zsingl;
        zcosi = zcosil;
        zsini = zsinil;
        zcosh = zcoshl * cosq + zsinhl * sinq;
        zsinh = sinq * zcoshl - cosq * zsinhl;
        zn = ZNL;
        cc = C1L;
        ze = ZEL;
    }

    deepspace_consts_.sse += se;
    deepspace_consts_.ssi += si;
    deepspace_consts_.ssl += sl;
    deepspace_consts_.ssg += sgh - cosio * shdq;
    deepspace_consts_.ssh += shdq;

    deepspace_consts_.shape = DeepSpaceConstants::NONE;

    if (elements_.RecoveredMeanMotion() < 0.0052359877
            && elements_.RecoveredMeanMotion() > 0.0034906585)
    {
        /*
         * 24h synchronous resonance terms initialisation
         */
        deepspace_consts_.shape = DeepSpaceConstants::SYNCHRONOUS;

        const double g200 = 1.0 + eosq * (-2.5 + 0.8125 * eosq);
        const double g310 = 1.0 + 2.0 * eosq;
        const double g300 = 1.0 + eosq * (-6.0 + 6.60937 * eosq);
        const double f220 = 0.75 * (1.0 + cosio) * (1.0 + cosio);
        const double f311 = 0.9375 * sinio * sinio * (1.0 + 3.0 * cosio)
            - 0.75 * (1.0 + cosio);
        double f330 = 1.0 + cosio;
        f330 = 1.875 * f330 * f330 * f330;
        deepspace_consts_.del1 = 3.0 * elements_.RecoveredMeanMotion()
            * elements_.RecoveredMeanMotion()
            * aqnv * aqnv;
        deepspace_consts_.del2 = 2.0 * deepspace_consts_.del1
            * f220 * g200 * Q22;
        deepspace_consts_.del3 = 3.0 * deepspace_consts_.del1
            * f330 * g300 * Q33 * aqnv;
        deepspace_consts_.del1 = deepspace_consts_.del1
            * f311 * g310 * Q31 * aqnv;

        deepspace_consts_.xlamo = Util::WrapTwoPI(elements_.MeanAnomoly()
                + elements_.AscendingNode()
                + elements_.ArgumentPerigee()
                - deepspace_consts_.gsto);
        bfact = xmdot + xpidot - kTHDT
            + deepspace_consts_.ssl
            + deepspace_consts_.ssg
            + deepspace_consts_.ssh;
    }
    else if (elements_.RecoveredMeanMotion() < 8.26e-3
            || elements_.RecoveredMeanMotion() > 9.24e-3
            || elements_.Eccentricity() < 0.5)
    {
        // do nothing
    }
    else
    {
        /*
         * geopotential resonance initialisation for 12 hour orbits
         */
        deepspace_consts_.shape = DeepSpaceConstants::RESONANCE;

        double g211;
        double g310;
        double g322;
        double g410;
        double g422;
        double g520;

        double g201 = -0.306 - (elements_.Eccentricity() - 0.64) * 0.440;

        if (elements_.Eccentricity() <= 0.65)
        {
            g211 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    3.616, -13.247, 16.290, 0.0);
            g310 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -19.302, 117.390, -228.419, 156.591);
            g322 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -18.9068, 109.7927, -214.6334, 146.5816);
            g410 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -41.122, 242.694, -471.094, 313.953);
            g422 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -146.407, 841.880, -1629.014, 1083.435);
            g520 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -532.114, 3017.977, -5740.032, 3708.276);
        }
        else
        {
            g211 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -72.099, 331.819, -508.738, 266.724);
            g310 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -346.844, 1582.851, -2415.925, 1246.113);
            g322 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -342.585, 1554.908, -2366.899, 1215.972);
            g410 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -1052.797, 4758.686, -7193.992, 3651.957);
            g422 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -3581.69, 16178.11, -24462.77, 12422.52);

            if (elements_.Eccentricity() <= 0.715)
            {
                g520 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                        1464.74, -4664.75, 3763.64, 0.0);
            }
            else
            {
                g520 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                        -5149.66, 29936.92, -54087.36, 31324.56);
            }
        }

        double g533;
        double g521;
        double g532;

        if (elements_.Eccentricity() < 0.7)
        {
            g533 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -919.2277, 4988.61, -9064.77, 5542.21);
            g521 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -822.71072, 4568.6173, -8491.4146, 5337.524);
            g532 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -853.666, 4690.25, -8624.77, 5341.4);
        }
        else
        {
            g533 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -37995.78, 161616.52, -229838.2, 109377.94);
            g521 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -51752.104, 218913.95, -309468.16, 146349.42);
            g532 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -40023.88, 170470.89, -242699.48, 115605.82);
        }

        const double sini2 = sinio * sinio;
        const double f220 = 0.75 * (1.0 + 2.0 * cosio + theta2);
        const double f221 = 1.5 * sini2;
        const double f321 = 1.875 * sinio * (1.0 - 2.0 * cosio - 3.0 * theta2);
        const double f322 = -1.875 * sinio * (1.0 + 2.0 * cosio - 3.0 * theta2);
        const double f441 = 35.0 * sini2 * f220;
        const double f442 = 39.3750 * sini2 * sini2;
        const double f522 = 9.84375 * sinio
            * (sini2 * (1.0 - 2.0 * cosio - 5.0 * theta2)
                + 0.33333333 * (-2.0 + 4.0 * cosio + 6.0 * theta2));
        const double f523 = sinio
            * (4.92187512 * sini2 * (-2.0 - 4.0 * cosio + 10.0 * theta2)
                + 6.56250012 * (1.0 + 2.0 * cosio - 3.0 * theta2));
        const double f542 = 29.53125 * sinio * (2.0 - 8.0 * cosio + theta2 *
                (-12.0 + 8.0 * cosio + 10.0 * theta2));
        const double f543 = 29.53125 * sinio * (-2.0 - 8.0 * cosio + theta2 *
                (12.0 + 8.0 * cosio - 10.0 * theta2));

        const double xno2 = elements_.RecoveredMeanMotion()
            * elements_.RecoveredMeanMotion();
        const double ainv2 = aqnv * aqnv;

        double temp1 = 3.0 * xno2 * ainv2;
        double temp = temp1 * ROOT22;
        deepspace_consts_.d2201 = temp * f220 * g201;
        deepspace_consts_.d2211 = temp * f221 * g211;

        temp1 *= aqnv;
        temp = temp1 * ROOT32;
        deepspace_consts_.d3210 = temp * f321 * g310;
        deepspace_consts_.d3222 = temp * f322 * g322;

        temp1 *= aqnv;
        temp = 2.0 * temp1 * ROOT44;
        deepspace_consts_.d4410 = temp * f441 * g410;
        deepspace_consts_.d4422 = temp * f442 * g422;

        temp1 *= aqnv;
        temp = temp1 * ROOT52;
        deepspace_consts_.d5220 = temp * f522 * g520;
        deepspace_consts_.d5232 = temp * f523 * g532;

        temp = 2.0 * temp1 * ROOT54;
        deepspace_consts_.d5421 = temp * f542 * g521;
        deepspace_consts_.d5433 = temp * f543 * g533;

        deepspace_consts_.xlamo = Util::WrapTwoPI(
                elements_.MeanAnomoly()
                + elements_.AscendingNode()
                + elements_.AscendingNode()
                - deepspace_consts_.gsto
                - deepspace_consts_.gsto);
        bfact = xmdot
            + xnodot + xnodot
            - kTHDT - kTHDT
            + deepspace_consts_.ssl
            + deepspace_consts_.ssh
            + deepspace_consts_.ssh;
    }

    if (deepspace_consts_.shape != DeepSpaceConstants::NONE)
    {
        /*
         * initialise integrator
         */
        deepspace_consts_.xfact = bfact - elements_.RecoveredMeanMotion();
        integrator_params_.atime = 0.0;
        integrator_params_.xni = elements_.RecoveredMeanMotion();
        integrator_params_.xli = deepspace_consts_.xlamo;
    }
}